

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QList<QUrl> * __thiscall
QFileDialogPrivate::userSelectedFiles(QList<QUrl> *__return_storage_ptr__,QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  Data *pDVar2;
  QUrl *pQVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  QModelIndex *index;
  QModelIndex *this_00;
  QString *path;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QUrl local_a0;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  pUVar1 = (this->qFileDialogUi).d;
  if ((pUVar1 == (Ui_QFileDialog *)0x0 | (this->super_QDialogPrivate).nativeDialogInUse) == 1) {
    selectedFiles_sys((QList<QUrl> *)&local_58,this);
    addDefaultSuffixToUrls(__return_storage_ptr__,this,(QList<QUrl> *)&local_58);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  }
  else {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)pUVar1->listView);
    QItemSelectionModel::selectedRows((int)&local_98);
    QList<QUrl>::reserve((QList<QUrl> *)&local_78,local_98.size);
    this_00 = local_98.ptr;
    for (lVar6 = local_98.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
      QModelIndex::data((QVariant *)&local_58,this_00,0x101);
      ::QVariant::toString();
      QUrl::fromLocalFile((QString *)&local_a0);
      QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_78,&local_a0);
      QUrl::~QUrl(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      ::QVariant::~QVariant((QVariant *)&local_58);
      this_00 = this_00 + 1;
    }
    if (local_78.size == 0) {
      QLineEdit::text((QString *)&local_58,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit
                     );
      uVar5 = local_58._16_8_;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      if ((undefined1 *)uVar5 != (undefined1 *)0x0) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        typedFiles((QStringList *)&local_58,this);
        QList<QUrl>::reserve((QList<QUrl> *)&local_78,local_58._16_8_);
        for (lVar6 = local_58._16_8_ * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          QUrl::fromLocalFile((QString *)&local_b8);
          QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_78,(QUrl *)&local_b8);
          QUrl::~QUrl((QUrl *)&local_b8);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
      }
    }
    qVar4 = local_78.size;
    pQVar3 = local_78.ptr;
    pDVar2 = local_78.d;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QUrl *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pQVar3;
    local_78.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
  }
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QFileDialogPrivate::userSelectedFiles() const
{
    QList<QUrl> files;

    if (!usingWidgets())
        return addDefaultSuffixToUrls(selectedFiles_sys());

    const QModelIndexList selectedRows = qFileDialogUi->listView->selectionModel()->selectedRows();
    files.reserve(selectedRows.size());
    for (const QModelIndex &index : selectedRows)
        files.append(QUrl::fromLocalFile(index.data(QFileSystemModel::FilePathRole).toString()));

    if (files.isEmpty() && !lineEdit()->text().isEmpty()) {
        const QStringList typedFilesList = typedFiles();
        files.reserve(typedFilesList.size());
        for (const QString &path : typedFilesList)
            files.append(QUrl::fromLocalFile(path));
    }

    return files;
}